

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall Instance::printTrainRoute(Instance *this)

{
  Train *pTVar1;
  pointer ppEVar2;
  Edge *pEVar3;
  Z3_lbool ZVar4;
  ostream *poVar5;
  Train *pTVar6;
  pointer ppEVar7;
  ulong uVar8;
  bool bVar9;
  model m;
  Train train;
  model local_b0;
  ast local_a0;
  ast local_90;
  Train local_80;
  
  z3::optimize::get_model((optimize *)&local_b0);
  pTVar1 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar6 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar6 != pTVar1; pTVar6 = pTVar6 + 1) {
    Train::Train(&local_80,pTVar6);
    bVar9 = false;
    for (uVar8 = 0; uVar8 < this->maxTimeSteps; uVar8 = uVar8 + 1) {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar5,": ");
      if ((bool)(uVar8 < local_80.start.arrivalTime | bVar9)) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      else {
        bVar9 = false;
        ppEVar2 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppEVar7 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                       _M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar2;
            ppEVar7 = ppEVar7 + 1) {
          pEVar3 = *ppEVar7;
          z3::ast_vector_tpl<z3::expr>::operator[]
                    ((ast_vector_tpl<z3::expr> *)&local_a0,
                     (int)(this->occupiedVars).
                          super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_80.id].
                          super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (int)(uVar8 << 4));
          z3::model::eval((model *)&local_90,(expr *)&local_b0,SUB81(&local_a0,0));
          ZVar4 = z3::expr::bool_value((expr *)&local_90);
          z3::ast::~ast(&local_90);
          z3::ast::~ast(&local_a0);
          if (ZVar4 == Z3_L_TRUE) {
            bVar9 = pEVar3 == local_80.stops.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl
                              .super__Vector_impl_data._M_finish[-1].stopEdge;
            poVar5 = std::operator<<((ostream *)&std::cout,"(");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pEVar3->to);
            poVar5 = std::operator<<(poVar5," ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pEVar3->from);
            std::operator<<(poVar5,") ");
          }
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    Train::~Train(&local_80);
  }
  z3::model::~model(&local_b0);
  return;
}

Assistant:

void Instance::printTrainRoute() {
  model m = solver.get_model();
  for (Train train : trains) {
    bool reachedGoal = false;
    for (size_t time = 0; time < maxTimeSteps; time++) {
      std::cout << time << ": "; 
      if(time < train.start.arrivalTime || reachedGoal){
        std::cout << std::endl;
        continue;
      }
      for (Edge *edge : graph.edges) {
        if (m.eval(occupiedVars[train.id][time][edge->id], false)
                .bool_value() == Z3_TRUE) {
          reachedGoal = edge == train.stops.back().stopEdge;
          std::cout << "(" << edge->to << " " << edge->from << ") ";
        }
      }
      std::cout << std::endl;
    }
    std::cout << std::endl;
  }
}